

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::cmQtAutoGenInitializer
          (cmQtAutoGenInitializer *this,cmQtAutoGenGlobalInitializer *globalInitializer,
          cmGeneratorTarget *target,IntegerVersion *qtVersion,bool mocEnabled,bool uicEnabled,
          bool rccEnabled,bool globalAutogenTarget,bool globalAutoRccTarget)

{
  this->GlobalInitializer = globalInitializer;
  this->Target = target;
  this->QtVersion = *qtVersion;
  this->MultiConfig = false;
  (this->ConfigDefault)._M_dataplus._M_p = (pointer)&(this->ConfigDefault).field_2;
  (this->ConfigDefault)._M_string_length = 0;
  (this->ConfigDefault).field_2._M_local_buf[0] = '\0';
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Verbosity)._M_dataplus._M_p = (pointer)&(this->Verbosity).field_2;
  (this->Verbosity)._M_string_length = 0;
  (this->Verbosity).field_2._M_local_buf[0] = '\0';
  (this->TargetsFolder)._M_dataplus._M_p = (pointer)&(this->TargetsFolder).field_2;
  (this->TargetsFolder)._M_string_length = 0;
  (this->TargetsFolder).field_2._M_local_buf[0] = '\0';
  this->CMP0071Accept = false;
  this->CMP0071Warn = false;
  {unnamed_type#1}::cmQtAutoGenInitializer(&this->Dir);
  {unnamed_type#2}::cmQtAutoGenInitializer(&this->AutogenTarget);
  MocT::MocT(&this->Moc);
  UicT::UicT(&this->Uic);
  RccT::RccT(&this->Rcc);
  (this->AutogenTarget).GlobalTarget = globalAutogenTarget;
  (this->Moc).super_GenVarsT.Enabled = mocEnabled;
  (this->Uic).super_GenVarsT.Enabled = uicEnabled;
  (this->Rcc).super_GenVarsT.Enabled = rccEnabled;
  (this->Rcc).GlobalTarget = globalAutoRccTarget;
  return;
}

Assistant:

cmQtAutoGenInitializer::cmQtAutoGenInitializer(
  cmQtAutoGenGlobalInitializer* globalInitializer, cmGeneratorTarget* target,
  IntegerVersion const& qtVersion, bool mocEnabled, bool uicEnabled,
  bool rccEnabled, bool globalAutogenTarget, bool globalAutoRccTarget)
  : GlobalInitializer(globalInitializer)
  , Target(target)
  , QtVersion(qtVersion)
{
  AutogenTarget.GlobalTarget = globalAutogenTarget;
  Moc.Enabled = mocEnabled;
  Uic.Enabled = uicEnabled;
  Rcc.Enabled = rccEnabled;
  Rcc.GlobalTarget = globalAutoRccTarget;
}